

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,iterator pos,size_type count,
          uchar *value)

{
  long lVar1;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar2;
  uint uVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = this->_size;
  uVar3 = uVar6 - 0x1d;
  ppVar4 = *(prevector<28U,_unsigned_char,_unsigned_int,_int> **)&this->_union;
  uVar5 = uVar3;
  ppVar2 = ppVar4;
  if (uVar6 < 0x1d) {
    uVar5 = uVar6;
    ppVar2 = this;
  }
  uVar7 = 0x1c;
  if (uVar6 >= 0x1d) {
    uVar7 = (this->_union).indirect_contents.capacity;
  }
  iVar8 = (int)pos.ptr - (int)ppVar2;
  uVar5 = uVar5 + count;
  if (uVar7 < uVar5) {
    change_capacity(this,(uVar5 >> 1) + uVar5);
    uVar6 = this->_size;
    ppVar4 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (this->_union).indirect_contents.indirect;
    uVar3 = uVar6 - 0x1d;
  }
  if (uVar6 < 0x1d) {
    uVar3 = uVar6;
    ppVar4 = this;
  }
  memmove((ppVar4->_union).direct + iVar8 + count,(ppVar4->_union).direct + iVar8,
          (ulong)(uVar3 - iVar8));
  uVar3 = this->_size + count;
  this->_size = uVar3;
  if (count == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    if (0x1c < uVar3) {
      this = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (this->_union).indirect_contents.indirect;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      memset((void *)((long)&this->_union + (long)iVar8),(uint)*value,(ulong)count);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void insert(iterator pos, size_type count, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + count;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        T* dst = ptr + count;
        memmove(dst, ptr, (size() - p) * sizeof(T));
        _size += count;
        fill(item_ptr(p), count, value);
    }